

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchNewQbf.cpp
# Opt level: O2

void Bmatch_PrepareFinalOut(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtkQbf,int ILP_Constraint)

{
  Abc_Aig_t *pMan;
  Abc_Obj_t *pAVar1;
  ostream *poVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  int i;
  long lVar5;
  Abc_Obj_t *pObjTmp;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> XorOuts;
  
  XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (i = 0; i < pNtk1->vPos->nSize; i = i + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk1->vPos,i);
    poVar2 = std::operator<<((ostream *)&std::cout,"Print Xor : ");
    std::endl<char,std::char_traits<char>>(poVar2);
    Abc_AigPrintNode((pAVar1->field_6).pCopy);
    pAVar3 = Abc_ObjChild0Copy(pAVar1);
    Abc_AigPrintNode(pAVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,"END.");
    std::endl<char,std::char_traits<char>>(poVar2);
    pMan = (Abc_Aig_t *)pNtkQbf->pManFunc;
    pAVar3 = (pAVar1->field_6).pCopy;
    pAVar1 = Abc_ObjChild0Copy(pAVar1);
    pObjTmp = Abc_AigXor(pMan,pAVar3,pAVar1);
    std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back(&XorOuts,&pObjTmp);
  }
  pObjTmp = *XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar4 = (long)XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
                super__Vector_impl_data._M_start;
  for (lVar5 = 1; lVar5 < (int)(uVar4 >> 3); lVar5 = lVar5 + 1) {
    pObjTmp = Abc_AigOr((Abc_Aig_t *)pNtkQbf->pManFunc,pObjTmp,
                        XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar5]);
  }
  pAVar3 = Abc_NtkCreateObj(pNtkQbf,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar3,"MainOut",(char *)0x0);
  Abc_ObjAddFanin(pAVar3,(Abc_Obj_t *)((ulong)pObjTmp ^ 1));
  Abc_AigCleanup((Abc_Aig_t *)pNtkQbf->pManFunc);
  std::_Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::~_Vector_base
            (&XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>);
  return;
}

Assistant:

void Bmatch_PrepareFinalOut 	( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtkQbf, int ILP_Constraint )
{
	vector< Abc_Obj_t * > XorOuts;
	Abc_Obj_t * pObj, * pObjTmp;
	char * pName;
	int i;

	Abc_NtkForEachPo( pNtk1, pObj, i ) {
cout << "Print Xor : " << endl;
		Abc_AigPrintNode(pObj->pCopy);
		Abc_AigPrintNode(Abc_ObjChild0Copy(pObj));
cout << "END." << endl;
		pObjTmp = Abc_AigXor( (Abc_Aig_t *)pNtkQbf->pManFunc, pObj->pCopy, Abc_ObjChild0Copy(pObj) );
		XorOuts.push_back( pObjTmp );
	}

	pObjTmp = XorOuts[0];
	for( int i = 1, n = XorOuts.size(); i < n; ++i ) {
		pObjTmp = Abc_AigOr( (Abc_Aig_t *)pNtkQbf->pManFunc, pObjTmp, XorOuts[i] );
	}

	pObj = Abc_NtkCreatePo( pNtkQbf );
	pName = "MainOut";
	Abc_ObjAssignName( pObj, pName, NULL );
	Abc_ObjAddFanin( pObj, Abc_ObjNot( pObjTmp ) );

	Abc_AigCleanup( (Abc_Aig_t *)pNtkQbf->pManFunc );
}